

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_input_is_mouse_click_in_rect(nk_input *i,nk_buttons id,nk_rect b)

{
  int iVar1;
  bool bVar2;
  nk_mouse_button *btn;
  nk_buttons id_local;
  nk_input *i_local;
  nk_rect b_local;
  
  if (i == (nk_input *)0x0) {
    b_local.w = 0.0;
  }
  else {
    iVar1 = nk_input_has_mouse_click_down_in_rect(i,id,b,0);
    bVar2 = false;
    if (iVar1 != 0) {
      bVar2 = (i->mouse).buttons[id].clicked != 0;
    }
    b_local.w = (float)(uint)bVar2;
  }
  return (int)b_local.w;
}

Assistant:

NK_API int
nk_input_is_mouse_click_in_rect(const struct nk_input *i, enum nk_buttons id,
    struct nk_rect b)
{
    const struct nk_mouse_button *btn;
    if (!i) return nk_false;
    btn = &i->mouse.buttons[id];
    return (nk_input_has_mouse_click_down_in_rect(i, id, b, nk_false) &&
            btn->clicked) ? nk_true : nk_false;
}